

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::OP_ClearAttributes(Var instance,PropertyId propertyId)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclableObject *pRVar4;
  
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2687,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (bVar2) {
    pRVar4 = VarTo<Js::RecyclableObject>(instance);
    UNRECOVERED_JUMPTABLE =
         (pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
         [0x3e];
    (*UNRECOVERED_JUMPTABLE)(pRVar4,propertyId,0,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void JavascriptOperators::OP_ClearAttributes(Var instance, PropertyId propertyId)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(OP_ClearAttributes);
        Assert(instance);

        if (VarIs<RecyclableObject>(instance))
        {
            RecyclableObject* obj = VarTo<RecyclableObject>(instance);
            obj->SetAttributes(propertyId, PropertyNone);
        }
        JIT_HELPER_END(OP_ClearAttributes);
    }